

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_Sort(ktxHashList *pHead)

{
  long lVar1;
  int iVar2;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  UT_hash_handle *pUVar8;
  UT_hash_handle *pUVar9;
  UT_hash_handle *pUVar10;
  void *pvVar11;
  bool bVar12;
  uint local_54;
  UT_hash_handle *local_50;
  
  if (pHead == (ktxHashList *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (*pHead == (ktxHashList)0x0) {
    return KTX_SUCCESS;
  }
  iVar6 = 1;
  pUVar3 = &(*pHead)->hh;
LAB_001cda5b:
  pUVar10 = (UT_hash_handle *)0x0;
  local_50 = (UT_hash_handle *)0x0;
  local_54 = 0;
LAB_001cda7e:
  pUVar9 = pUVar3;
  if (iVar6 == 0) {
    iVar5 = 0;
  }
  else {
    iVar7 = 1;
    do {
      if (pUVar9->next == (void *)0x0) {
        pUVar9 = (UT_hash_handle *)0x0;
        iVar5 = iVar7;
        break;
      }
      pUVar9 = (UT_hash_handle *)((long)pUVar9->next + (((*pHead)->hh).tbl)->hho);
      bVar12 = iVar7 != iVar6;
      iVar7 = iVar7 + 1;
      iVar5 = iVar6;
    } while (bVar12);
  }
  local_54 = local_54 + 1;
  pUVar4 = pUVar3;
  iVar7 = iVar6;
  do {
    pUVar3 = pUVar9;
    if (iVar5 == 0) {
      if (pUVar3 == (UT_hash_handle *)0x0 || iVar7 == 0) break;
      if (pUVar3->next == (void *)0x0) {
        pUVar9 = (UT_hash_handle *)0x0;
      }
      else {
        pUVar9 = (UT_hash_handle *)((long)pUVar3->next + (((*pHead)->hh).tbl)->hho);
      }
      iVar7 = iVar7 + -1;
      iVar5 = 0;
    }
    else {
      pUVar9 = pUVar3;
      if (pUVar3 == (UT_hash_handle *)0x0 || iVar7 == 0) {
        if (pUVar4->next == (void *)0x0) {
          pUVar8 = (UT_hash_handle *)0x0;
        }
        else {
          pUVar8 = (UT_hash_handle *)((long)pUVar4->next + (((*pHead)->hh).tbl)->hho);
        }
        iVar5 = iVar5 + -1;
        pUVar3 = pUVar4;
        pUVar4 = pUVar8;
      }
      else {
        lVar1 = (((*pHead)->hh).tbl)->hho;
        iVar2 = strcmp(*(char **)((long)pUVar4 + (8 - lVar1)),*(char **)((long)pUVar3 + (8 - lVar1))
                      );
        if (iVar2 < 1) {
          pUVar8 = (UT_hash_handle *)(lVar1 + (long)pUVar4->next);
          if (pUVar4->next == (void *)0x0) {
            pUVar8 = (UT_hash_handle *)0x0;
          }
          iVar5 = iVar5 + -1;
          pUVar3 = pUVar4;
          pUVar4 = pUVar8;
        }
        else {
          pUVar9 = (UT_hash_handle *)(lVar1 + (long)pUVar3->next);
          if (pUVar3->next == (void *)0x0) {
            pUVar9 = (UT_hash_handle *)0x0;
          }
          iVar7 = iVar7 + -1;
        }
      }
    }
    if (pUVar10 == (UT_hash_handle *)0x0) {
      pvVar11 = (void *)0x0;
      local_50 = pUVar3;
    }
    else {
      pUVar10->next = (void *)((long)pUVar3 - (((*pHead)->hh).tbl)->hho);
      pvVar11 = (void *)((long)pUVar10 - (((*pHead)->hh).tbl)->hho);
    }
    pUVar3->prev = pvVar11;
    pUVar10 = pUVar3;
  } while( true );
  if (pUVar3 == (UT_hash_handle *)0x0) goto code_r0x001cdbda;
  goto LAB_001cda7e;
code_r0x001cdbda:
  pUVar10->next = (void *)0x0;
  if (local_54 < 2) goto LAB_001cdc18;
  iVar6 = iVar6 * 2;
  pUVar3 = local_50;
  if (local_50 == (UT_hash_handle *)0x0) {
    _DAT_00000010 = 0;
    pUVar10 = (UT_hash_handle *)0x0;
    local_50 = (UT_hash_handle *)0x0;
LAB_001cdc18:
    (((*pHead)->hh).tbl)->tail = pUVar10;
    *pHead = (ktxHashList)((long)local_50 - (((*pHead)->hh).tbl)->hho);
    return KTX_SUCCESS;
  }
  goto LAB_001cda5b;
}

Assistant:

KTX_error_code
ktxHashList_Sort(ktxHashList* pHead)
{
    if (pHead) {
        //ktxKVListEntry* kv = (ktxKVListEntry*)pHead;

        HASH_SORT(*pHead, sort_by_key_codepoint);
        return KTX_SUCCESS;
    } else {
        return KTX_INVALID_VALUE;
    }
}